

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fBasicComputeShaderTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_2::CopyInvertSSBOCase::CopyInvertSSBOCase
          (CopyInvertSSBOCase *this,Context *context,char *name,char *description,int numValues,
          IVec3 *localSize,IVec3 *workSize)

{
  undefined4 in_register_00000084;
  
  gles31::TestCase::TestCase
            (&this->super_TestCase,context,name,"Copy between SSBOs, inverting bits");
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_01e62268;
  this->m_numValues = (int)description;
  tcu::Vector<int,_3>::Vector
            (&this->m_localSize,(Vector<int,_3> *)CONCAT44(in_register_00000084,numValues));
  tcu::Vector<int,_3>::Vector(&this->m_workSize,localSize);
  return;
}

Assistant:

CopyInvertSSBOCase (Context& context, const char* name, const char* description, int numValues, const tcu::IVec3& localSize, const tcu::IVec3& workSize)
		: TestCase		(context, name, description)
		, m_numValues	(numValues)
		, m_localSize	(localSize)
		, m_workSize	(workSize)
	{
		DE_ASSERT(m_numValues % (m_workSize[0]*m_workSize[1]*m_workSize[2]*m_localSize[0]*m_localSize[1]*m_localSize[2]) == 0);
	}